

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DGXMLScanner::scanCDSection(DGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  bool bVar3;
  XMLCh toAppend;
  int iVar4;
  uint toFormat;
  StackElem *pSVar5;
  UnexpectedEOFException *this_02;
  Codes toEmit;
  bool bVar6;
  XMLBufBid bbCData;
  XMLCh tmpBuf [9];
  
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  bVar2 = ReaderMgr::skippedChar(this_00,L'[');
  if (!bVar2) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedOpenSquareBracket);
    ReaderMgr::skipPastSpaces(this_00);
    bVar2 = ReaderMgr::skippedChar(this_00,L'[');
    if (!bVar2) {
      return;
    }
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  bbCData.fBuffer = XMLBufferMgr::bidOnBuffer(this_01);
  bbCData.fMgr = this_01;
  pSVar5 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
  iVar4 = (*(pSVar5->fThisElement->super_XSerializable)._vptr_XSerializable[6])();
  bVar2 = false;
  bVar6 = false;
  do {
    toAppend = ReaderMgr::getNextChar(this_00);
    toFormat = (uint)(ushort)toAppend;
    if (toAppend == L'\0') {
      XMLScanner::emitError(&this->super_XMLScanner,UnterminatedCDATASection);
      this_02 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_02,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                 ,0xbd7,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_02,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
    }
    if (((((this->super_XMLScanner).fValidate == true) &&
         ((this->super_XMLScanner).fStandalone == true)) &&
        ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[toFormat] < '\0'))
       && ((iVar4 == 1 && (pSVar5->fThisElement->fExternalElement != false)))) {
      XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
    }
    if ((toAppend == L']') && (bVar3 = ReaderMgr::skippedString(this_00,L"]>"), bVar3)) {
      if (bVar2) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      if ((iVar4 != 2) && ((this->super_XMLScanner).fValidate != false)) {
        XMLValidator::emitError((this->super_XMLScanner).fValidator,NoCharDataInCM);
      }
      pXVar1 = (this->super_XMLScanner).fDocHandler;
      if (pXVar1 != (XMLDocumentHandler *)0x0) {
        (bbCData.fBuffer)->fBuffer[(bbCData.fBuffer)->fIndex] = L'\0';
        (*pXVar1->_vptr_XMLDocumentHandler[2])();
      }
      XMLBufBid::~XMLBufBid(&bbCData);
      return;
    }
    bVar3 = !bVar6;
    bVar6 = true;
    if (bVar3) {
      if ((short)(toFormat & 0xfc00) == -0x2400) {
        toEmit = Unexpected2ndSurrogateChar;
        bVar6 = false;
        bVar3 = !bVar2;
        bVar2 = false;
        if (bVar3) {
LAB_002a17b3:
          bVar2 = false;
          XMLScanner::emitError(&this->super_XMLScanner,toEmit);
          bVar6 = false;
        }
      }
      else if ((toFormat & 0xfc00) == 0xd800) {
        if (bVar2) {
          XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
        }
        else {
          bVar2 = true;
        }
        bVar6 = false;
      }
      else {
        toEmit = Expected2ndSurrogateChar;
        if (bVar2) goto LAB_002a17b3;
        bVar2 = false;
        bVar6 = false;
        if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[toFormat] & 0x40) ==
            0) {
          XMLString::binToText(toFormat,tmpBuf,8,0x10,(this->super_XMLScanner).fMemoryManager);
          XMLScanner::emitError
                    (&this->super_XMLScanner,InvalidCharacter,tmpBuf,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          bVar2 = false;
          bVar6 = true;
        }
      }
    }
    XMLBuffer::append(bbCData.fBuffer,toAppend);
  } while( true );
}

Assistant:

void DGXMLScanner::scanCDSection()
{
    static const XMLCh CDataClose[] =
    {
            chCloseSquare, chCloseAngle, chNull
    };

    //  The next character should be the opening square bracket. If not
    //  issue an error, but then try to recover by skipping any whitespace
    //  and checking again.
    if (!fReaderMgr.skippedChar(chOpenSquare))
    {
        emitError(XMLErrs::ExpectedOpenSquareBracket);
        fReaderMgr.skipPastSpaces();

        // If we still don't find it, then give up, else keep going
        if (!fReaderMgr.skippedChar(chOpenSquare))
            return;
    }

    // Get a buffer for this
    XMLBufBid bbCData(&fBufMgr);

    //  We just scan forward until we hit the end of CDATA section sequence.
    //  CDATA is effectively a big escape mechanism so we don't treat markup
    //  characters specially here.
    bool            emittedError = false;
    bool     gotLeadingSurrogate = false;

    // Get the character data opts for the current element
    const ElemStack::StackElem* topElem = fElemStack.topElement();
    XMLElementDecl::CharDataOpts charOpts =  topElem->fThisElement->getCharDataOpts();

    while (true)
    {
        const XMLCh nextCh = fReaderMgr.getNextChar();

        // Watch for unexpected end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedCDATASection);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        if (fValidate && fStandalone && (fReaderMgr.getCurrentReader()->isWhitespace(nextCh)))
        {
            // This document is standalone; this ignorable CDATA whitespace is forbidden.
            // XML 1.0, Section 2.9
            // And see if the current element is a 'Children' style content model
            if (topElem->fThisElement->isExternal()) {

                if (charOpts == XMLElementDecl::SpacesOk) // Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                }
            }
        }

        //  If this is a close square bracket it could be our closing
        //  sequence.
        if (nextCh == chCloseSquare && fReaderMgr.skippedString(CDataClose))
        {
            //  make sure we were not expecting a trailing surrogate.
            if (gotLeadingSurrogate)
                emitError(XMLErrs::Expected2ndSurrogateChar);

            if (fValidate) {

                if (charOpts != XMLElementDecl::AllCharData)
                {
                    // They definitely cannot handle any type of char data
                    fValidator->emitError(XMLValid::NoCharDataInCM);
                }
            }

            // If we have a doc handler, call it
            if (fDocHandler)
            {
                fDocHandler->docCharacters
                    (
                    bbCData.getRawBuffer()
                    , bbCData.getLen()
                    , true
                    );
            }

            // And we are done
            break;
        }

        //  Make sure its a valid character. But if we've emitted an error
        //  already, don't bother with the overhead since we've already told
        //  them about it.
        if (!emittedError)
        {
            // Deal with surrogate pairs
            if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        emittedError = true;
                    }
                }
                gotLeadingSurrogate = false;
            }
        }

        // Add it to the buffer
        bbCData.append(nextCh);
    }
}